

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int32_t float128_to_int32_m68k(float128 a,float_status *status)

{
  int32_t iVar1;
  uint64_t absZ;
  byte zSign;
  ulong uVar2;
  uint64_t aSig1;
  ulong uVar3;
  ushort uVar4;
  
  uVar3 = a.high & 0xffffffffffff;
  uVar4 = a.high._6_2_ & 0x7fff;
  uVar2 = uVar3 + 0x1000000000000;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    uVar2 = uVar3;
  }
  absZ = a.low != 0 | uVar2;
  if (uVar4 < 0x4028) {
    if (uVar4 < 0x3fe9) {
      absZ = (uint64_t)(absZ != 0);
    }
    else {
      absZ = (ulong)(absZ << (a.high._6_1_ + 0x18U & 0x3f) != 0) |
             absZ >> (0x28U - (char)uVar4 & 0x3f);
    }
  }
  zSign = 0;
  if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
      a.low == 0) {
    zSign = a.high._7_1_ >> 7;
  }
  if (uVar4 != 0x7fff) {
    zSign = a.high._7_1_ >> 7;
  }
  iVar1 = roundAndPackInt32(zSign,absZ,status);
  return iVar1;
}

Assistant:

int32_t float128_to_int32(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( ( aExp == 0x7FFF ) && ( aSig0 | aSig1 ) ) aSign = 0;
    if ( aExp ) aSig0 |= UINT64_C(0x0001000000000000);
    aSig0 |= ( aSig1 != 0 );
    shiftCount = 0x4028 - aExp;
    if ( 0 < shiftCount ) shift64RightJamming( aSig0, shiftCount, &aSig0 );
    return roundAndPackInt32(aSign, aSig0, status);

}